

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.h
# Opt level: O2

void __thiscall QNativeIpcKey::~QNativeIpcKey(QNativeIpcKey *this)

{
  if (this->d != (QNativeIpcKeyPrivate *)0x0) {
    QNativeIpcKey::destroy_internal();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->key).d);
  return;
}

Assistant:

~QNativeIpcKey()
    {
        if (isSlowPath())
            destroy_internal();
    }